

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O2

void IoTHubTransport_AMQP_Common_DoWork(TRANSPORT_LL_HANDLE handle)

{
  PDLIST_ENTRY Entry;
  long lVar1;
  int iVar2;
  int iVar3;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  LIST_ITEM_HANDLE item_handle;
  undefined8 *on_methods_error_context;
  char *pcVar4;
  code *pcVar5;
  AMQP_CONNECTION_HANDLE pAVar6;
  CBS_HANDLE cbs_handle_00;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  DLIST_ENTRY_TAG **message;
  CBS_HANDLE cbs_handle;
  RETRY_ACTION retry_action;
  uint uStack_64;
  XIO_HANDLE local_60;
  _Bool local_58;
  _Bool local_57;
  _Bool local_56;
  code *local_50;
  TRANSPORT_LL_HANDLE local_48;
  size_t local_40;
  double local_38;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
               ,"IoTHubTransport_AMQP_Common_DoWork",0x58f,1,
               "IoTHubClient DoWork failed: transport handle parameter is NULL.");
    return;
  }
  if (*(int *)((long)handle + 0x40) == 7) {
    return;
  }
  if (*(int *)((long)handle + 0x40) == 4) {
    iVar2 = retry_control_should_retry(*(RETRY_CONTROL_HANDLE *)((long)handle + 0x48),&retry_action)
    ;
    if (iVar2 == 0) {
      if (retry_action == RETRY_ACTION_STOP_RETRYING) {
        *(undefined4 *)((long)handle + 0x40) = 7;
        singlylinkedlist_foreach
                  (*(SINGLYLINKEDLIST_HANDLE *)((long)handle + 0x28),
                   raise_connection_status_callback_retry_expired,(void *)0x0);
        return;
      }
      if (retry_action != RETRY_ACTION_RETRY_NOW) {
        return;
      }
    }
    else {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                   ,"IoTHubTransport_AMQP_Common_DoWork",0x5a0,1,
                   "retry_control_should_retry() failed; assuming immediate connection retry for safety."
                  );
      }
      _retry_action = (SESSION_HANDLE)((ulong)uStack_64 << 0x20);
    }
    prepare_for_connection_retry((AMQP_TRANSPORT_INSTANCE *)handle);
    return;
  }
  item_handle = singlylinkedlist_get_head_item(*(SINGLYLINKEDLIST_HANDLE *)((long)handle + 0x28));
  if (item_handle == (LIST_ITEM_HANDLE)0x0) goto LAB_0012d350;
  if (*(long *)((long)handle + 0x18) == 0) {
    if (*(int *)((long)handle + 0x24) == 0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar4 = 
        "Failed establishing connection (transport doesn\'t have a preferred authentication mode set; unexpected!)."
        ;
        iVar2 = 0x2f1;
LAB_0012d312:
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                   ,"establish_amqp_connection",iVar2,1,pcVar4);
      }
    }
    else if ((*(long *)((long)handle + 8) == 0) &&
            (iVar2 = get_new_underlying_io_transport
                               ((AMQP_TRANSPORT_INSTANCE *)handle,(XIO_HANDLE *)((long)handle + 8)),
            iVar2 != 0)) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar4 = "Failed establishing connection (failed to obtain a TLS I/O transport layer).";
        iVar2 = 0x2f7;
        goto LAB_0012d312;
      }
    }
    else {
      _retry_action = (SESSION_HANDLE)STRING_c_str(*handle);
      local_60 = *(XIO_HANDLE *)((long)handle + 8);
      local_56 = *(_Bool *)((long)handle + 0x30);
      local_50 = on_amqp_connection_state_changed;
      local_40 = *(size_t *)((long)handle + 0x50);
      local_38 = *(double *)((long)handle + 0x58);
      if (*(int *)((long)handle + 0x24) == 1) {
        local_58 = true;
        local_57 = local_58;
      }
      else if (*(int *)((long)handle + 0x24) == 2) {
        local_58 = false;
        local_57 = local_58;
      }
      *(undefined4 *)((long)handle + 0x20) = 2;
      *(uint *)((long)handle + 0x40) = (uint)(*(int *)((long)handle + 0x40) == 5) * 4 + 2;
      local_48 = handle;
      pAVar6 = amqp_connection_create((AMQP_CONNECTION_CONFIG *)&retry_action);
      *(AMQP_CONNECTION_HANDLE *)((long)handle + 0x18) = pAVar6;
      if (pAVar6 != (AMQP_CONNECTION_HANDLE)0x0) goto LAB_0012ca92;
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar4 = "Failed establishing connection (failed to create the amqp_connection instance).";
        iVar2 = 0x31e;
        goto LAB_0012d312;
      }
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar4 = "AMQP transport failed to establish connection with service.";
      iVar2 = 0x5b8;
LAB_0012d344:
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                 ,"IoTHubTransport_AMQP_Common_DoWork",iVar2,1,pcVar4);
    }
  }
  else {
LAB_0012ca92:
    if (*(int *)((long)handle + 0x20) != 1) goto LAB_0012d350;
    uVar9 = 0;
    uVar8 = 0;
    while (item_handle != (LIST_ITEM_HANDLE)0x0) {
      on_methods_error_context = (undefined8 *)singlylinkedlist_item_get_value(item_handle);
      if (on_methods_error_context == (undefined8 *)0x0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                     ,"IoTHubTransport_AMQP_Common_DoWork",0x5c7,1,
                     "Transport had an unexpected failure during DoWork (failed to fetch a registered_devices list item value)"
                    );
        }
      }
      else if ((ulong)on_methods_error_context[6] < 5) {
        iVar2 = *(int *)(on_methods_error_context + 4);
        if (iVar2 - 1U < 2) {
          iVar2 = is_timeout_reached(on_methods_error_context[7],
                                     *(uint *)(on_methods_error_context + 8),(_Bool *)&retry_action)
          ;
          if (iVar2 == 0) {
            iVar2 = 0;
            if ((undefined1)retry_action != RETRY_ACTION_RETRY_LATER) goto LAB_0012d0a6;
            pcVar4 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            iVar2 = 0x42a;
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              if (pcVar4 == (char *)0x0) {
                pcVar4 = "NULL";
              }
              iVar3 = 0x428;
              pcVar7 = 
              "Failed performing DoWork for device \'%s\' (device failed to start or stop within expected timeout)"
              ;
              goto LAB_0012ce05;
            }
          }
          else {
            pcVar4 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            iVar2 = 0x423;
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              if (pcVar4 == (char *)0x0) {
                pcVar4 = "NULL";
              }
              iVar3 = 0x421;
              pcVar7 = 
              "Failed performing DoWork for device \'%s\' (failed tracking timeout of device %d state)"
              ;
LAB_0012ce05:
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                         ,"IoTHubTransport_AMQP_Common_Device_DoWork",iVar3,1,pcVar7,pcVar4);
            }
          }
          *(undefined4 *)(on_methods_error_context + 4) = 4;
          goto LAB_0012d0a6;
        }
        if (iVar2 == 3) {
          if ((*(char *)(on_methods_error_context + 10) == '\x01') &&
             (*(char *)((long)on_methods_error_context + 0x51) == '\0')) {
            iVar2 = amqp_connection_get_session_handle
                              (*(AMQP_CONNECTION_HANDLE *)(on_methods_error_context[2] + 0x18),
                               (SESSION_HANDLE *)&retry_action);
            if (iVar2 == 0) {
              pcVar5 = on_methods_unsubscribed;
              iVar2 = iothubtransportamqp_methods_subscribe
                                ((IOTHUBTRANSPORT_AMQP_METHODS_HANDLE)on_methods_error_context[9],
                                 _retry_action,on_methods_error,on_methods_error_context,
                                 on_method_request_received,on_methods_error_context,
                                 on_methods_unsubscribed,on_methods_error_context);
              if (iVar2 == 0) {
                *(undefined1 *)((long)on_methods_error_context + 0x51) = 1;
                goto LAB_0012cc31;
              }
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                iVar2 = 0x1f8;
                pcVar4 = "Cannot subscribe for methods";
                goto LAB_0012cfd6;
              }
            }
            else {
              pcVar5 = (code *)STRING_c_str((STRING_HANDLE)*on_methods_error_context);
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                if (pcVar5 == (code *)0x0) {
                  pcVar5 = (code *)0x191199;
                }
                iVar2 = 499;
                pcVar4 = 
                "Device \'%s\' failed subscribing for methods (failed getting session handle)";
LAB_0012cfd6:
                (*UNRECOVERED_JUMPTABLE)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                           ,"subscribe_methods",iVar2,1,pcVar4,pcVar5);
              }
            }
            pcVar4 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              if (pcVar4 == (char *)0x0) {
                pcVar4 = "NULL";
              }
              iVar2 = 0x44d;
              pcVar7 = 
              "Failed performing DoWork for device \'%s\' (failed registering for device methods)";
LAB_0012d026:
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                         ,"IoTHubTransport_AMQP_Common_Device_DoWork",iVar2,1,pcVar7,pcVar4);
            }
          }
          else {
LAB_0012cc31:
            do {
              iVar3 = DList_IsListEmpty((PDLIST_ENTRY)on_methods_error_context[3]);
              iVar2 = 0;
              if (iVar3 != 0) goto LAB_0012d0a6;
              Entry = *(PDLIST_ENTRY *)on_methods_error_context[3];
              DList_RemoveEntryList(Entry);
              message = &Entry[-2].Blink;
              if (message == (DLIST_ENTRY_TAG **)0x0) goto LAB_0012d0a6;
              iVar2 = amqp_device_send_event_async
                                ((AMQP_DEVICE_HANDLE)on_methods_error_context[1],
                                 (IOTHUB_MESSAGE_LIST *)message,on_event_send_complete,
                                 on_methods_error_context);
            } while (iVar2 == 0);
            pcVar4 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              if (pcVar4 == (char *)0x0) {
                pcVar4 = "NULL";
              }
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                         ,"send_pending_events",0x3e6,1,
                         "Device \'%s\' failed to send message (amqp_device_send_event_async failed)"
                         ,pcVar4);
            }
            on_event_send_complete
                      ((IOTHUB_MESSAGE_LIST *)message,
                       D2C_EVENT_SEND_COMPLETE_RESULT_ERROR_FAIL_SENDING,on_methods_error_context);
            pcVar4 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              if (pcVar4 == (char *)0x0) {
                pcVar4 = "NULL";
              }
              iVar2 = 0x456;
              pcVar7 = "Failed performing DoWork for device \'%s\' (failed sending pending events)";
              goto LAB_0012d026;
            }
          }
          on_methods_error_context[5] = on_methods_error_context[5] + 1;
          iVar2 = 0x458;
        }
        else if (iVar2 == 0) {
          cbs_handle = (CBS_HANDLE)0x0;
          iVar2 = amqp_connection_get_session_handle
                            (*(AMQP_CONNECTION_HANDLE *)(on_methods_error_context[2] + 0x18),
                             (SESSION_HANDLE *)&retry_action);
          if (iVar2 == 0) {
            if (*(int *)(on_methods_error_context[2] + 0x24) == 1) {
              iVar2 = amqp_connection_get_cbs_handle
                                (*(AMQP_CONNECTION_HANDLE *)(on_methods_error_context[2] + 0x18),
                                 &cbs_handle);
              cbs_handle_00 = cbs_handle;
              if (iVar2 != 0) {
                pcVar4 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                iVar2 = 0x40d;
                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                  if (pcVar4 == (char *)0x0) {
                    pcVar4 = "NULL";
                  }
                  iVar3 = 0x40c;
                  pcVar7 = 
                  "Failed performing DoWork for device \'%s\' (failed to get the amqp_connection cbs_handle)"
                  ;
                  iVar2 = 0x40d;
                  goto LAB_0012d09d;
                }
                goto LAB_0012d0a6;
              }
            }
            else {
              cbs_handle_00 = (CBS_HANDLE)0x0;
            }
            iVar2 = amqp_device_start_async
                              ((AMQP_DEVICE_HANDLE)on_methods_error_context[1],_retry_action,
                               cbs_handle_00);
            if (iVar2 == 0) {
LAB_0012d0a4:
              iVar2 = 0;
            }
            else {
              pcVar4 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              iVar2 = 0x413;
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                if (pcVar4 == (char *)0x0) {
                  pcVar4 = "NULL";
                }
                iVar3 = 0x412;
                pcVar7 = "Failed performing DoWork for device \'%s\' (failed to start device)";
                iVar2 = 0x413;
                goto LAB_0012d09d;
              }
            }
          }
          else {
            pcVar4 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            iVar2 = 0x406;
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              if (pcVar4 == (char *)0x0) {
                pcVar4 = "NULL";
              }
              iVar3 = 0x405;
              pcVar7 = 
              "Failed performing DoWork for device \'%s\' (failed to get the amqp_connection session_handle)"
              ;
              iVar2 = 0x406;
              goto LAB_0012d09d;
            }
          }
        }
        else {
          lVar1 = on_methods_error_context[5];
          on_methods_error_context[5] = lVar1 + 1U;
          if (lVar1 + 1U < 5) {
            iVar2 = amqp_device_delayed_stop((AMQP_DEVICE_HANDLE)on_methods_error_context[1],10);
            if (iVar2 == 0) goto LAB_0012d0a4;
            pcVar4 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            iVar2 = 0x458;
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              if (pcVar4 == (char *)0x0) {
                pcVar4 = "NULL";
              }
              iVar3 = 0x43f;
              pcVar7 = "Failed to stop reset device \'%s\' (amqp_device_stop failed)";
              iVar2 = 0x458;
              goto LAB_0012d09d;
            }
          }
          else {
            pcVar4 = STRING_c_str((STRING_HANDLE)*on_methods_error_context);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            iVar2 = 0x458;
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              if (pcVar4 == (char *)0x0) {
                pcVar4 = "NULL";
              }
              iVar3 = 0x439;
              pcVar7 = 
              "Failed performing DoWork for device \'%s\' (device reported state %d; number of previous failures: %lu)"
              ;
              iVar2 = 0x458;
LAB_0012d09d:
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                         ,"IoTHubTransport_AMQP_Common_Device_DoWork",iVar3,1,pcVar7,pcVar4);
            }
          }
        }
LAB_0012d0a6:
        amqp_device_do_work((AMQP_DEVICE_HANDLE)on_methods_error_context[1]);
        if (iVar2 != 0) {
          uVar9 = (uVar9 + 1) - (ulong)((ulong)on_methods_error_context[5] < 5);
        }
      }
      else {
        uVar9 = uVar9 + 1;
      }
      item_handle = singlylinkedlist_get_next_item(item_handle);
      uVar8 = uVar8 + 1;
    }
    if ((uVar9 == 0) || ((float)uVar9 / (float)uVar8 < 0.0)) goto LAB_0012d350;
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar4 = "Reconnection required. %zd of %zd registered devices are failing.";
      iVar2 = 0x5dc;
      goto LAB_0012d344;
    }
  }
  *(undefined4 *)((long)handle + 0x40) = 4;
LAB_0012d350:
  if (*(AMQP_CONNECTION_HANDLE *)((long)handle + 0x18) != (AMQP_CONNECTION_HANDLE)0x0) {
    amqp_connection_do_work(*(AMQP_CONNECTION_HANDLE *)((long)handle + 0x18));
  }
  return;
}

Assistant:

void IoTHubTransport_AMQP_Common_DoWork(TRANSPORT_LL_HANDLE handle)
{
    if (handle == NULL)
    {
        LogError("IoTHubClient DoWork failed: transport handle parameter is NULL.");
    }
    else
    {
        AMQP_TRANSPORT_INSTANCE* transport_instance = (AMQP_TRANSPORT_INSTANCE*)handle;
        LIST_ITEM_HANDLE list_item;

        if (transport_instance->state == AMQP_TRANSPORT_STATE_NOT_CONNECTED_NO_MORE_RETRIES)
        {
            // Nothing to be done.
        }
        else if (transport_instance->state == AMQP_TRANSPORT_STATE_RECONNECTION_REQUIRED)
        {
            RETRY_ACTION retry_action;

            if (retry_control_should_retry(transport_instance->connection_retry_control, &retry_action) != RESULT_OK)
            {
                LogError("retry_control_should_retry() failed; assuming immediate connection retry for safety.");
                retry_action = RETRY_ACTION_RETRY_NOW;
            }

            if (retry_action == RETRY_ACTION_RETRY_NOW)
            {
                prepare_for_connection_retry(transport_instance);
            }
            else if (retry_action == RETRY_ACTION_STOP_RETRYING)
            {
                update_state(transport_instance, AMQP_TRANSPORT_STATE_NOT_CONNECTED_NO_MORE_RETRIES);

                (void)singlylinkedlist_foreach(transport_instance->registered_devices, raise_connection_status_callback_retry_expired, NULL);
            }
        }
        else
        {
            if ((list_item = singlylinkedlist_get_head_item(transport_instance->registered_devices)) != NULL)
            {
                // We need to check if there are devices, otherwise the amqp_connection won't be able to be created since
                // there is not a preferred authentication mode set yet on the transport.

                if (transport_instance->amqp_connection == NULL && establish_amqp_connection(transport_instance) != RESULT_OK)
                {
                    LogError("AMQP transport failed to establish connection with service.");

                    update_state(transport_instance, AMQP_TRANSPORT_STATE_RECONNECTION_REQUIRED);
                }
                else if (transport_instance->amqp_connection_state == AMQP_CONNECTION_STATE_OPENED)
                {
                    size_t number_of_devices = 0;
                    size_t number_of_faulty_devices = 0;

                    while (list_item != NULL)
                    {
                        AMQP_TRANSPORT_DEVICE_INSTANCE* registered_device;

                        if ((registered_device = (AMQP_TRANSPORT_DEVICE_INSTANCE*)singlylinkedlist_item_get_value(list_item)) == NULL)
                        {
                            LogError("Transport had an unexpected failure during DoWork (failed to fetch a registered_devices list item value)");
                        }
                        else if (registered_device->number_of_send_event_complete_failures >= DEVICE_FAILURE_COUNT_RECONNECTION_THRESHOLD)
                        {
                            number_of_faulty_devices++;
                        }
                        else if (IoTHubTransport_AMQP_Common_Device_DoWork(registered_device) != RESULT_OK)
                        {
                            if (registered_device->number_of_previous_failures >= DEVICE_FAILURE_COUNT_RECONNECTION_THRESHOLD)
                            {
                                number_of_faulty_devices++;
                            }
                        }

                        list_item = singlylinkedlist_get_next_item(list_item);
                        number_of_devices++;
                    }

                    if (number_of_faulty_devices > 0 &&
                        ((float)number_of_faulty_devices/(float)number_of_devices) >= DEVICE_MULTIPLEXING_FAULTY_DEVICE_RATIO_RECONNECTION_THRESHOLD)
                    {
                        LogError("Reconnection required. %zd of %zd registered devices are failing.", number_of_faulty_devices, number_of_devices);

                        update_state(transport_instance, AMQP_TRANSPORT_STATE_RECONNECTION_REQUIRED);
                    }
                }
            }

            if (transport_instance->amqp_connection != NULL)
            {
                amqp_connection_do_work(transport_instance->amqp_connection);
            }
        }
    }
}